

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O0

void Fxu_MatrixRingCubesUnmark(Fxu_Matrix *p)

{
  Fxu_Cube *local_30;
  Fxu_Cube *local_28;
  Fxu_Cube *local_20;
  Fxu_Cube *pCube2;
  Fxu_Cube *pCube;
  Fxu_Matrix *p_local;
  
  if (p->pOrderCubes != (Fxu_Cube *)0x0) {
    pCube2 = p->pOrderCubes;
    if (pCube2 == (Fxu_Cube *)0x1) {
      local_28 = (Fxu_Cube *)0x1;
    }
    else {
      local_28 = pCube2->pOrder;
    }
    local_20 = local_28;
    while (pCube2 != (Fxu_Cube *)0x1) {
      pCube2->pOrder = (Fxu_Cube *)0x0;
      pCube2 = local_20;
      if (local_20 == (Fxu_Cube *)0x1) {
        local_30 = (Fxu_Cube *)0x1;
      }
      else {
        local_30 = local_20->pOrder;
      }
      local_20 = local_30;
    }
  }
  p->pOrderCubes = (Fxu_Cube *)0x0;
  p->ppTailCubes = (Fxu_Cube **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingCubesUnmark( Fxu_Matrix * p )
{
	Fxu_Cube * pCube, * pCube2;
    // unmark the cubes
    Fxu_MatrixForEachCubeInRingSafe( p, pCube, pCube2 )
        pCube->pOrder = NULL;
    Fxu_MatrixRingCubesReset( p );
}